

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::copyTexImage2D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,
          int width,int height,int border)

{
  uint uVar1;
  pointer pTVar2;
  ChannelOrder CVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  TextureCube *pTVar10;
  int xo;
  Texture2D *pTVar11;
  int iVar12;
  PixelBufferAccess dst;
  MultisampleConstPixelBufferAccess src;
  TextureFormat local_a0;
  pointer local_98;
  MultisamplePixelBufferAccess local_90;
  MultisampleConstPixelBufferAccess local_68;
  
  iVar12 = this->m_activeTexture;
  pTVar2 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a0.order = CHANNELORDER_LAST;
  local_a0.type = CHANNELTYPE_LAST;
  getReadColorbuffer(&local_90,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_68,&local_90);
  if ((border != 0) || ((width | level | height) < 0)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (((local_68.m_access.m_size.m_data[0] == 0) || (local_68.m_access.m_size.m_data[1] == 0)) ||
     (local_68.m_access.m_size.m_data[2] == 0)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x502;
    return;
  }
  local_98 = pTVar2 + iVar12;
  local_a0 = mapInternalFormat(internalFormat);
  CVar3 = local_a0.order;
  if (CVar3 == CHANNELORDER_LAST || (ulong)local_a0 >> 0x20 == 0x26) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (target == 0xde1) {
    uVar1 = (this->m_limits).maxTexture2DSize;
    if (width <= (int)uVar1 && height <= (int)uVar1) {
      if (uVar1 == 0) {
        uVar6 = 0x20;
      }
      else {
        uVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = uVar6 ^ 0x1f;
      }
      if (level <= (int)(0x1f - uVar6)) {
        pTVar11 = &local_98->default2DTex;
        if (local_98->tex2DBinding != (Texture2D *)0x0) {
          pTVar11 = local_98->tex2DBinding;
        }
        if ((pTVar11->super_Texture).m_immutable == true) {
          if (((0xd < (uint)level) ||
              (uVar8 = (ulong)(uint)level,
              *(long *)((long)((pTVar11->m_levels).m_data + uVar8) + 8) == 0)) ||
             ((local_90.m_access.super_ConstPixelBufferAccess.m_format =
                    *(TextureFormat *)((pTVar11->m_levels).m_access + uVar8),
              CVar3 != local_90.m_access.super_ConstPixelBufferAccess.m_format.order ||
              (((local_a0.type != local_90.m_access.super_ConstPixelBufferAccess.m_format.type ||
                (*(int *)((long)((pTVar11->m_levels).m_access + uVar8) + 8) != width)) ||
               (*(int *)((long)((pTVar11->m_levels).m_access + uVar8) + 0xc) != height)))))) {
LAB_0098789b:
            if (this->m_lastError != 0) {
              return;
            }
            this->m_lastError = 0x502;
            return;
          }
        }
        else {
          rc::TextureLevelArray::allocLevel(&pTVar11->m_levels,level,&local_a0,width,height,1);
          uVar8 = (ulong)level;
          local_90.m_access.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)((pTVar11->m_levels).m_access + uVar8);
        }
        lVar4 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar4] =
               *(int *)((long)((pTVar11->m_levels).m_access + uVar8) + 8U + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        lVar4 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar4] =
               *(int *)((long)((pTVar11->m_levels).m_access + uVar8) + 0x14U + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_90.m_access.super_ConstPixelBufferAccess.m_data =
             *(void **)((long)((pTVar11->m_levels).m_access + uVar8) + 0x20);
        if (height < 1) {
          return;
        }
        iVar12 = 0;
        do {
          if (0 < width) {
            iVar9 = 0;
            do {
              iVar7 = x + iVar9;
              if (((-1 < iVar7) && (iVar7 < local_68.m_access.m_size.m_data[1])) &&
                 ((-1 < iVar12 + y && (iVar12 + y < local_68.m_access.m_size.m_data[2])))) {
                rr::resolveMultisamplePixel
                          ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                           (int)&local_68,iVar7);
                tcu::PixelBufferAccess::setPixel
                          (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,iVar9,iVar12,0);
              }
              iVar9 = iVar9 + 1;
            } while (width != iVar9);
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 != height);
        return;
      }
    }
  }
  else {
    if (5 < target - 0x8515) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    if ((width == height) && (uVar1 = (this->m_limits).maxTextureCubeSize, width <= (int)uVar1)) {
      if (uVar1 == 0) {
        uVar6 = 0x20;
      }
      else {
        uVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = uVar6 ^ 0x1f;
      }
      if (level <= (int)(0x1f - uVar6)) {
        pTVar10 = &local_98->defaultCubeTex;
        if (local_98->texCubeBinding != (TextureCube *)0x0) {
          pTVar10 = local_98->texCubeBinding;
        }
        lVar4 = *(long *)(&DAT_00b63ec8 + (long)(short)((short)target + 0x7aeb) * 8);
        if ((pTVar10->super_Texture).m_immutable == true) {
          if (((0xd < (uint)level) ||
              (uVar8 = (ulong)(uint)level,
              *(long *)((long)(pTVar10->m_levels[lVar4].m_data + uVar8) + 8) == 0)) ||
             ((local_90.m_access.super_ConstPixelBufferAccess.m_format =
                    *(TextureFormat *)(pTVar10->m_levels[lVar4].m_access + uVar8),
              CVar3 != local_90.m_access.super_ConstPixelBufferAccess.m_format.order ||
              (((local_a0.type != local_90.m_access.super_ConstPixelBufferAccess.m_format.type ||
                (*(int *)((long)(pTVar10->m_levels[lVar4].m_access + uVar8) + 8) != width)) ||
               (*(int *)((long)(pTVar10->m_levels[lVar4].m_access + uVar8) + 0xc) != width))))))
          goto LAB_0098789b;
        }
        else {
          rc::TextureLevelArray::allocLevel(pTVar10->m_levels + lVar4,level,&local_a0,width,width,1)
          ;
          uVar8 = (ulong)level;
          local_90.m_access.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)(pTVar10->m_levels[lVar4].m_access + uVar8);
        }
        lVar5 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar5] =
               *(int *)((long)(pTVar10->m_levels[lVar4].m_access + uVar8) + 8U + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        lVar5 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar5] =
               *(int *)((long)(pTVar10->m_levels[lVar4].m_access + uVar8) + 0x14U + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_90.m_access.super_ConstPixelBufferAccess.m_data =
             *(void **)((long)(pTVar10->m_levels[lVar4].m_access + uVar8) + 0x20);
        if (width < 1) {
          return;
        }
        iVar12 = 0;
        do {
          iVar9 = 0;
          do {
            iVar7 = x + iVar9;
            if (((-1 < iVar7) && (iVar7 < local_68.m_access.m_size.m_data[1])) &&
               ((-1 < iVar12 + y && (iVar12 + y < local_68.m_access.m_size.m_data[2])))) {
              rr::resolveMultisamplePixel
                        ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                         (int)&local_68,iVar7);
              tcu::PixelBufferAccess::setPixel
                        (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,iVar9,iVar12,0);
            }
            iVar9 = iVar9 + 1;
          } while (width != iVar9);
          iVar12 = iVar12 + 1;
        } while (iVar12 != width);
        return;
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexImage2D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int height, int border)
{
	TextureUnit&							unit		= m_textureUnits[m_activeTexture];
	TextureFormat							storageFmt;
	rr::MultisampleConstPixelBufferAccess	src			= getReadColorbuffer();

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src), GL_INVALID_OPERATION, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height > m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2D* texture = unit.tex2DBinding ? unit.tex2DBinding : &unit.default2DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getLevel(level);
		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo, yo);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		// Validate size and level.
		RC_IF_ERROR(width != height || width > m_limits.maxTextureCubeSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTextureCubeSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCube*	texture	= unit.texCubeBinding ? unit.texCubeBinding : &unit.defaultCubeTex;
		tcu::CubeFace	face	= mapGLCubeFace(target);

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasFace(level, face), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getFace(level, face));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocFace(level, face, storageFmt, width, height);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getFace(level, face);
		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo, yo);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}